

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O3

Literal_t * Lit_Alloc(uint *pTruth,int nVars,int varIdx,char pol)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint *__ptr;
  uint *puVar4;
  uint *pOut;
  uint *__ptr_00;
  ulong uVar5;
  Vec_Str_t *pVVar6;
  char *pcVar7;
  Literal_t *pLVar8;
  int iVar9;
  undefined7 in_register_00000009;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint *cof1;
  uint *ncof1;
  size_t __size;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  
  iVar9 = (int)CONCAT71(in_register_00000009,pol);
  if ((iVar9 != 0x2b) && (iVar9 != 0x2d)) {
    __assert_fail("pol == \'+\' || pol == \'-\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/rpo/literal.h"
                  ,0x88,"Literal_t *Lit_Alloc(unsigned int *, int, int, char)");
  }
  uVar11 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar11 = 1;
  }
  __size = (long)(int)uVar11 << 2;
  __ptr = (uint *)malloc(__size);
  puVar4 = (uint *)malloc(__size);
  pOut = (uint *)malloc(__size);
  Kit_TruthCofactor0New(puVar4,pTruth,nVars,varIdx);
  Kit_TruthCofactor1New(pOut,pTruth,nVars,varIdx);
  __ptr_00 = (uint *)malloc(__size);
  uVar12 = (ulong)uVar11;
  if (pol == '+') {
    if (0 < (int)uVar11) {
      uVar5 = uVar12 + 1;
      do {
        __ptr_00[uVar5 - 2] = ~puVar4[uVar5 - 2];
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
      uVar5 = uVar12 + 1;
      do {
        __ptr[uVar5 - 2] = pOut[uVar5 - 2] & __ptr_00[uVar5 - 2];
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
    }
    if (puVar4 != (uint *)0x0) {
      free(puVar4);
    }
    puVar4 = pOut;
    if (__ptr_00 != (uint *)0x0) {
      free(__ptr_00);
    }
    goto joined_r0x00570f10;
  }
  if ((int)uVar11 < 1) {
    if (puVar4 != (uint *)0x0) goto LAB_00570ef5;
  }
  else {
    uVar5 = uVar12 + 1;
    do {
      __ptr_00[uVar5 - 2] = ~pOut[uVar5 - 2];
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
    uVar5 = uVar12 + 1;
    do {
      __ptr[uVar5 - 2] = puVar4[uVar5 - 2] & __ptr_00[uVar5 - 2];
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
LAB_00570ef5:
    free(puVar4);
  }
  puVar4 = __ptr_00;
  if (pOut != (uint *)0x0) {
    free(pOut);
  }
joined_r0x00570f10:
  uVar5 = uVar12;
  if (puVar4 != (uint *)0x0) {
    free(puVar4);
  }
  do {
    if ((int)uVar5 < 1) {
      if (__ptr != (uint *)0x0) {
        free(__ptr);
      }
      return (Literal_t *)0x0;
    }
    lVar10 = uVar5 - 1;
    uVar5 = uVar5 - 1;
  } while (__ptr[lVar10] == 0);
  puVar4 = (uint *)malloc(__size);
  auVar2 = _DAT_008403e0;
  if (varIdx < 5) {
    if (0 < (int)uVar11) {
      uVar1 = *(undefined4 *)(&DAT_00953bf0 + (ulong)(uint)varIdx * 4);
      lVar10 = uVar12 - 1;
      auVar13._8_4_ = (int)lVar10;
      auVar13._0_8_ = lVar10;
      auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
      lVar10 = 0;
      auVar13 = auVar13 ^ _DAT_008403e0;
      auVar17 = _DAT_008403c0;
      auVar16 = _DAT_008403d0;
      do {
        auVar18 = auVar16 ^ auVar2;
        iVar9 = auVar13._4_4_;
        if ((bool)(~(auVar18._4_4_ == iVar9 && auVar13._0_4_ < auVar18._0_4_ ||
                    iVar9 < auVar18._4_4_) & 1)) {
          *(undefined4 *)((long)puVar4 + lVar10) = uVar1;
        }
        if ((auVar18._12_4_ != auVar13._12_4_ || auVar18._8_4_ <= auVar13._8_4_) &&
            auVar18._12_4_ <= auVar13._12_4_) {
          *(undefined4 *)((long)puVar4 + lVar10 + 4) = uVar1;
        }
        iVar19 = SUB164(auVar17 ^ auVar2,4);
        if (iVar19 <= iVar9 && (iVar19 != iVar9 || SUB164(auVar17 ^ auVar2,0) <= auVar13._0_4_)) {
          *(undefined4 *)((long)puVar4 + lVar10 + 8) = uVar1;
          *(undefined4 *)((long)puVar4 + lVar10 + 0xc) = uVar1;
        }
        lVar15 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 4;
        auVar16._8_8_ = lVar15 + 4;
        lVar15 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 4;
        auVar17._8_8_ = lVar15 + 4;
        lVar10 = lVar10 + 0x10;
      } while ((ulong)(uVar11 + 3 >> 2) << 4 != lVar10);
    }
  }
  else if (0 < (int)uVar11) {
    uVar3 = 1 << ((char)varIdx - 5U & 0x1f);
    lVar10 = uVar12 - 1;
    auVar14._8_4_ = (int)lVar10;
    auVar14._0_8_ = lVar10;
    auVar14._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar5 = 0;
    auVar14 = auVar14 ^ _DAT_008403e0;
    auVar18 = _DAT_008403d0;
    do {
      auVar17 = auVar18 ^ auVar2;
      if ((bool)(~(auVar17._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar17._0_4_ ||
                  auVar14._4_4_ < auVar17._4_4_) & 1)) {
        puVar4[uVar5] = -(uint)((uVar3 & (uint)uVar5) != 0);
      }
      if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
          auVar17._12_4_ <= auVar14._12_4_) {
        puVar4[uVar5 + 1] = -(uint)(((uint)uVar5 + 1 & uVar3) != 0);
      }
      uVar5 = uVar5 + 2;
      lVar10 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 2;
      auVar18._8_8_ = lVar10 + 2;
    } while ((uVar11 + 1 & 0xfffffffe) != uVar5);
  }
  pVVar6 = (Vec_Str_t *)malloc(0x10);
  pVVar6->nCap = 0x10;
  pcVar7 = (char *)malloc(0x10);
  uVar3 = 0;
  pVVar6->pArray = pcVar7;
  if (pol == '-') {
    if (0 < (int)uVar11) {
      uVar12 = uVar12 + 1;
      do {
        puVar4[uVar12 - 2] = ~puVar4[uVar12 - 2];
        uVar12 = uVar12 - 1;
      } while (1 < uVar12);
    }
    *pcVar7 = '!';
    uVar3 = 1;
  }
  pcVar7[uVar3] = (char)varIdx + 'a';
  pVVar6->nSize = uVar3 | 2;
  pcVar7[(ulong)uVar3 + 1] = '\0';
  pLVar8 = (Literal_t *)malloc(0x18);
  pLVar8->function = puVar4;
  pLVar8->transition = __ptr;
  pLVar8->expression = pVVar6;
  return pLVar8;
}

Assistant:

static inline Literal_t* Lit_Alloc(unsigned* pTruth, int nVars, int varIdx, char pol) {
    unsigned * transition;
    unsigned * function;
    Vec_Str_t * exp;
    Literal_t* lit;
    assert(pol == '+' || pol == '-');
    transition = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
    if (pol == '+') {
        Lit_TruthPositiveTransition(pTruth, transition, nVars, varIdx);
    } else {
        Lit_TruthNegativeTransition(pTruth, transition, nVars, varIdx);
    }
    if (!Kit_TruthIsConst0(transition,nVars)) {
        function = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
        Kit_TruthIthVar(function, nVars, varIdx);
        //Abc_Print(-2, "Allocating function %X %d %c \n", *function, varIdx, pol);
        exp = Vec_StrAlloc(5);
        if (pol == '-') {
            Kit_TruthNot(function, function, nVars);
            Vec_StrPutC(exp, '!');
        }
        Vec_StrPutC(exp, (char)('a' + varIdx));
        Vec_StrPutC(exp, '\0');
        lit = ABC_ALLOC(Literal_t, 1);
        lit->function = function;
        lit->transition = transition;
        lit->expression = exp;
        return lit;
    } else {
        ABC_FREE(transition); // free the function.
        return NULL;
    }
}